

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000018b6d0 = 0x2d2d2d2d2d2d2d;
    uRam000000000018b6d7 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0018b6c0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000018b6c8 = 0x2d2d2d2d2d2d2d;
    DAT_0018b6cf = 0x2d;
    _DAT_0018b6b0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000018b6b8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0018b6a0 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000018b6a8 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam000000000018b698 = 0x2d2d2d2d2d2d2d2d;
    DAT_0018b6df = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void printOpenHeader( std::string const& _name ) {
            stream  << getLineOfChars<'-'>() << "\n";
            {
                Colour colourGuard( Colour::Headers );
                printHeaderString( _name );
            }
        }